

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O2

void __thiscall fizplex::Base::~Base(Base *this)

{
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
            (&this->row_ordering);
  std::valarray<double>::~valarray(&(this->work).vals);
  std::vector<fizplex::Base::ETM,_std::allocator<fizplex::Base::ETM>_>::~vector(&this->etms);
  return;
}

Assistant:

Base() = delete;